

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodePtr xmlXPathNextPrecedingInternal(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  _xmlNode *p_Var2;
  xmlNodePtr pxVar3;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) &&
     (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) {
    if (cur == (xmlNodePtr)0x0) {
      cur = pxVar1->node;
      if (cur == (xmlNodePtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (cur->type == XML_NAMESPACE_DECL) {
        cur = (xmlNodePtr)cur->_private;
        if (cur == (xmlNodePtr)0x0) {
          return (xmlNodePtr)0x0;
        }
        if (cur->type == XML_NAMESPACE_DECL) {
          return (xmlNodePtr)0x0;
        }
      }
      else if (cur->type == XML_ATTRIBUTE_NODE) {
        cur = cur->parent;
      }
      ctxt->ancestor = cur->parent;
    }
    if (cur->type != XML_NAMESPACE_DECL) {
      p_Var2 = cur->prev;
      if ((p_Var2 != (_xmlNode *)0x0) && (p_Var2->type == XML_DTD_NODE)) {
        cur = p_Var2;
      }
      while( true ) {
        p_Var2 = cur->prev;
        if (cur->prev != (xmlNodePtr)0x0) {
          do {
            pxVar3 = p_Var2;
            p_Var2 = pxVar3->last;
          } while (p_Var2 != (_xmlNode *)0x0);
          return pxVar3;
        }
        cur = cur->parent;
        if ((cur == (xmlNodePtr)0x0) || (cur == pxVar1->doc->children)) break;
        if (cur != ctxt->ancestor) {
          return cur;
        }
        ctxt->ancestor = cur->parent;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXPathNextPrecedingInternal(xmlXPathParserContextPtr ctxt,
                              xmlNodePtr cur)
{
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur == NULL)
            return (NULL);
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
        ctxt->ancestor = cur->parent;
    }
    if (cur->type == XML_NAMESPACE_DECL)
        return(NULL);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE))
	cur = cur->prev;
    while (cur->prev == NULL) {
        cur = cur->parent;
        if (cur == NULL)
            return (NULL);
        if (cur == ctxt->context->doc->children)
            return (NULL);
        if (cur != ctxt->ancestor)
            return (cur);
        ctxt->ancestor = cur->parent;
    }
    cur = cur->prev;
    while (cur->last != NULL)
        cur = cur->last;
    return (cur);
}